

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O3

int mbedtls_mpi_write_file(char *p,mbedtls_mpi *X,int radix,FILE *fout)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  char *__s;
  size_t n;
  char s [2484];
  size_t local_9f0;
  char local_9e8 [2488];
  
  iVar1 = -4;
  if (0xfffffff0 < radix - 0x11U) {
    memset(local_9e8,0,0x9b4);
    iVar1 = mbedtls_mpi_write_string(X,radix,local_9e8,0x9b2,&local_9f0);
    if (iVar1 == 0) {
      __s = anon_var_dwarf_2de8d + 9;
      if (p != (char *)0x0) {
        __s = p;
      }
      sVar2 = strlen(__s);
      sVar3 = strlen(local_9e8);
      (local_9e8 + sVar3)[0] = '\r';
      (local_9e8 + sVar3)[1] = '\n';
      if (fout == (FILE *)0x0) {
        printf("%s%s",__s,local_9e8);
      }
      else {
        sVar4 = fwrite(__s,1,sVar2,(FILE *)fout);
        if (sVar4 != sVar2) {
          return -2;
        }
        sVar2 = fwrite(local_9e8,1,sVar3 + 2,(FILE *)fout);
        if (sVar2 != sVar3 + 2) {
          return -2;
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_mpi_write_file( const char *p, const mbedtls_mpi *X, int radix, FILE *fout )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t n, slen, plen;
    /*
     * Buffer should have space for (short) label and decimal formatted MPI,
     * newline characters and '\0'
     */
    char s[ MBEDTLS_MPI_RW_BUFFER_SIZE ];
    MPI_VALIDATE_RET( X != NULL );

    if( radix < 2 || radix > 16 )
        return( MBEDTLS_ERR_MPI_BAD_INPUT_DATA );

    memset( s, 0, sizeof( s ) );

    MBEDTLS_MPI_CHK( mbedtls_mpi_write_string( X, radix, s, sizeof( s ) - 2, &n ) );

    if( p == NULL ) p = "";

    plen = strlen( p );
    slen = strlen( s );
    s[slen++] = '\r';
    s[slen++] = '\n';

    if( fout != NULL )
    {
        if( fwrite( p, 1, plen, fout ) != plen ||
            fwrite( s, 1, slen, fout ) != slen )
            return( MBEDTLS_ERR_MPI_FILE_IO_ERROR );
    }
    else
        mbedtls_printf( "%s%s", p, s );

cleanup:

    return( ret );
}